

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

void __thiscall
ParsedLPCMTrackData::extractData(ParsedLPCMTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  bool bVar1;
  size_t sVar2;
  uint8_t *puVar3;
  uint8_t *local_30;
  uint8_t *dst;
  int size_local;
  uint8_t *buff_local;
  AVPacket *pkt_local;
  ParsedLPCMTrackData *this_local;
  
  sVar2 = MemoryBlock::size(&this->m_waveBuffer);
  pkt->size = size + (int)sVar2;
  puVar3 = (uint8_t *)operator_new__((long)pkt->size);
  pkt->data = puVar3;
  local_30 = pkt->data;
  bVar1 = MemoryBlock::isEmpty(&this->m_waveBuffer);
  if (!bVar1) {
    puVar3 = MemoryBlock::data(&this->m_waveBuffer);
    sVar2 = MemoryBlock::size(&this->m_waveBuffer);
    memcpy(local_30,puVar3,sVar2);
    sVar2 = MemoryBlock::size(&this->m_waveBuffer);
    local_30 = local_30 + sVar2;
    MemoryBlock::clear(&this->m_waveBuffer);
  }
  if ((this->m_convertBytes & 1U) == 0) {
    memcpy(local_30,buff,(long)size);
  }
  else {
    wave_format::toLittleEndian(local_30,buff,size,(uint)this->m_bitdepth);
  }
  return;
}

Assistant:

void ParsedLPCMTrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    pkt->size = size + static_cast<int>(m_waveBuffer.size());
    pkt->data = new uint8_t[pkt->size];
    uint8_t* dst = pkt->data;
    if (!m_waveBuffer.isEmpty())
    {
        memcpy(dst, m_waveBuffer.data(), m_waveBuffer.size());
        dst += m_waveBuffer.size();
        m_waveBuffer.clear();
    }
    if (m_convertBytes)
        toLittleEndian(dst, buff, size, m_bitdepth);
    else
        memcpy(dst, buff, size);
}